

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.cpp
# Opt level: O3

int __thiscall dic::dictRelese(dic *this,int dictidx)

{
  void *pvVar1;
  long lVar2;
  pointer pdVar3;
  dict *__last;
  void *pvVar4;
  ulong uVar5;
  
  lVar2 = (long)dictidx;
  pdVar3 = (this->dc).super__Vector_base<dict,_std::allocator<dict>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar3[lVar2].ht[0].size != 0) {
    uVar5 = 0;
    do {
      pvVar4 = *(void **)((long)pdVar3[lVar2].ht[0].table + uVar5 * 8);
      if (pvVar4 != (void *)0x0) {
        do {
          pvVar1 = *(void **)((long)pvVar4 + 0x10);
          operator_delete(pvVar4);
          pvVar4 = pvVar1;
        } while (pvVar1 != (void *)0x0);
        pdVar3 = (this->dc).super__Vector_base<dict,_std::allocator<dict>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (uVar5 < pdVar3[lVar2].ht[0].size);
  }
  if ((pdVar3[lVar2].rehashidx != -1) && (*(unsigned_long *)((long)(pdVar3[lVar2].ht + 1) + 8) != 0)
     ) {
    uVar5 = 0;
    do {
      pvVar4 = *(void **)((long)pdVar3[lVar2].ht[1].table + uVar5 * 8);
      if (pvVar4 != (void *)0x0) {
        do {
          pvVar1 = *(void **)((long)pvVar4 + 0x10);
          operator_delete(pvVar4);
          pvVar4 = pvVar1;
        } while (pvVar1 != (void *)0x0);
        pdVar3 = (this->dc).super__Vector_base<dict,_std::allocator<dict>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (uVar5 < *(unsigned_long *)((long)(pdVar3[lVar2].ht + 1) + 8));
  }
  __last = (this->dc).super__Vector_base<dict,_std::allocator<dict>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar3 + lVar2 + 1 != __last) {
    std::__copy_move<true,false,std::random_access_iterator_tag>::__copy_m<dict*,dict*>
              (pdVar3 + lVar2 + 1,__last,pdVar3 + lVar2);
    __last = (this->dc).super__Vector_base<dict,_std::allocator<dict>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  (this->dc).super__Vector_base<dict,_std::allocator<dict>_>._M_impl.super__Vector_impl_data.
  _M_finish = __last + -1;
  return 1;
}

Assistant:

int dic::dictRelese(int dictidx){
    dictEntry *fetch=NULL;
    dictEntry *tmp=NULL;
    //relese ht
    for(unsigned int i=0;i<dc[dictidx].ht[0].size;i++){
        fetch=dc[dictidx].ht[0].table[i];
        while(fetch!=NULL){
            tmp=fetch;
            fetch=fetch->next;
            delete tmp;
            tmp=NULL;
        }
    }  
    if(dc[dictidx].rehashidx!=-1){
        for(unsigned int i=0;i<dc[dictidx].ht[1].size;i++){
            fetch=dc[dictidx].ht[1].table[i];
            while(fetch!=NULL){
                tmp=fetch;
                fetch=fetch->next;
                delete tmp;
                tmp=NULL;
            }
        }  
    } 
    //delete database
    dc.erase(dc.begin()+dictidx);

    return 1;
}